

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O2

bool slang::ast::CallExpression::bindArgs
               (ArgumentListSyntax *argSyntax,
               span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
               formalArgs,string_view symbolName,SourceRange range,ASTContext *context,
               SmallVectorBase<const_slang::ast::Expression_*> *boundArgs,bool isBuiltInMethod)

{
  string_view *psVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  SyntaxNode *pSVar5;
  SyntaxKind *pSVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  ExpressionSyntax *pEVar11;
  Type *pTVar12;
  uint64_t uVar13;
  SourceLocation SVar14;
  Diagnostic *pDVar15;
  ulong uVar16;
  SyntaxNode *pSVar17;
  byte bVar18;
  Info *pIVar19;
  FormalArgumentSymbol *pFVar20;
  basic_string_view<char,_std::char_traits<char>_> *pbVar21;
  __extent_storage<18446744073709551615UL> sv;
  ArgumentListSyntax *pAVar22;
  ArgumentListSyntax *pAVar23;
  SyntaxNode *pSVar24;
  ulong uVar25;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
  *pair;
  table_element_pointer ppVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 uVar30;
  undefined1 uVar31;
  char cVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  char cVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  char cVar38;
  NumericTokenFlags NVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  char cVar42;
  byte bVar43;
  SourceRange SVar44;
  string_view sVar45;
  string_view arg;
  string_view arg_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool isBuiltInMethod_local;
  FormalArgumentSymbol *local_290;
  ulong local_288;
  Expression *expr;
  ArgumentListSyntax *local_278;
  ASTContext *local_270;
  SyntaxNode *local_268;
  Info *local_260;
  SourceLocation local_258;
  SourceLocation local_250;
  SyntaxNode *local_248;
  SyntaxNode *local_240;
  size_t local_238;
  ArgumentListSyntax *local_230;
  __extent_storage<18446744073709551615UL> local_228;
  undefined1 uStack_220;
  undefined1 uStack_21f;
  char cStack_21e;
  NumericTokenFlags NStack_21d;
  undefined1 uStack_21c;
  undefined1 uStack_21b;
  char cStack_21a;
  byte bStack_219;
  iterator __begin2;
  anon_class_16_2_d3173bde addDefaultDriver;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> orderedArgs;
  NamedArgMap namedArgs;
  
  pAVar22 = (ArgumentListSyntax *)formalArgs._M_ptr;
  isBuiltInMethod_local = isBuiltInMethod;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ =
       (pointer)orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len = 0;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.cap = 5;
  pAVar23 = pAVar22;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::SmallMap(&namedArgs);
  if ((argSyntax == (ArgumentListSyntax *)0x0) ||
     (bVar7 = Expression::collectArgs
                        (context,argSyntax,
                         &orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>,
                         &namedArgs), pAVar23 = argSyntax, bVar7)) {
    argSyntax = pAVar23;
    addDefaultDriver.isBuiltInMethod = &isBuiltInMethod_local;
    pSVar5 = &pAVar22->super_SyntaxNode;
    local_250 = range.startLoc;
    local_258 = range.endLoc;
    uVar16 = 0;
    pIVar19 = (Info *)0x0;
    local_270 = context;
    local_240 = (SyntaxNode *)symbolName._M_str;
    local_238 = formalArgs._M_extent._M_extent_value._M_extent_value;
    local_230 = (ArgumentListSyntax *)symbolName._M_len;
    addDefaultDriver.context = context;
    while( true ) {
      uVar25 = uVar16 & 0xffffffff;
      if (pAVar22 ==
          (ArgumentListSyntax *)
          (&pSVar5->kind + formalArgs._M_extent._M_extent_value._M_extent_value * 2)) break;
      pFVar20 = *(FormalArgumentSymbol **)&pAVar22->super_SyntaxNode;
      expr = (Expression *)0x0;
      local_290 = pFVar20;
      local_260 = pIVar19;
      if (uVar25 < orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len) {
        local_268 = orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_
                    [uVar25];
        if (local_268->kind == EmptyArgument) {
          expr = FormalArgumentSymbol::getDefaultValue(pFVar20);
          if (expr == (Expression *)0x0) {
            SVar44 = slang::syntax::SyntaxNode::sourceRange(local_268);
            pDVar15 = ASTContext::addDiag(context,(DiagCode)0x7,SVar44);
            Diagnostic::operator<<
                      (pDVar15,(pFVar20->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
          }
          else {
            bindArgs::anon_class_16_2_d3173bde::operator()(&addDefaultDriver,expr,pFVar20);
          }
        }
        else {
          pEVar11 = ASTContext::requireSimpleExpr(context,(PropertyExprSyntax *)local_268);
          pFVar20 = local_290;
          if (pEVar11 != (ExpressionSyntax *)0x0) {
            pTVar12 = DeclaredType::getType
                                (&(local_290->super_VariableSymbol).super_ValueSymbol.declaredType);
            expr = Expression::bindArgument
                             (pTVar12,pFVar20->direction,
                              (bitmask<slang::ast::VariableFlags>)
                              (underlying_type)*(undefined4 *)&(pFVar20->super_VariableSymbol).flags
                              ,pEVar11,context);
          }
        }
        local_288 = (ulong)((int)uVar16 + 1);
        sv._M_extent_value =
             (size_t)&(pFVar20->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
        argSyntax = (ArgumentListSyntax *)sv._M_extent_value;
        uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &namedArgs.super_Storage.field_0x108,
                            (basic_string_view<char,_std::char_traits<char>_> *)sv._M_extent_value);
        uVar25 = uVar13 >> (namedArgs._272_1_ & 0x3f);
        lVar2 = (uVar13 & 0xff) * 4;
        cVar32 = (&UNK_007e24cc)[lVar2];
        cVar35 = (&UNK_007e24cd)[lVar2];
        cVar38 = (&UNK_007e24ce)[lVar2];
        bVar18 = (&UNK_007e24cf)[lVar2];
        pSVar17 = (SyntaxNode *)0x0;
        do {
          pcVar3 = (char *)(namedArgs._288_8_ + uVar25 * 0x10);
          bVar9 = pcVar3[0xf];
          auVar29[0] = -(*pcVar3 == cVar32);
          auVar29[1] = -(pcVar3[1] == cVar35);
          auVar29[2] = -(pcVar3[2] == cVar38);
          auVar29[3] = -(pcVar3[3] == bVar18);
          auVar29[4] = -(pcVar3[4] == cVar32);
          auVar29[5] = -(pcVar3[5] == cVar35);
          auVar29[6] = -(pcVar3[6] == cVar38);
          auVar29[7] = -(pcVar3[7] == bVar18);
          auVar29[8] = -(pcVar3[8] == cVar32);
          auVar29[9] = -(pcVar3[9] == cVar35);
          auVar29[10] = -(pcVar3[10] == cVar38);
          auVar29[0xb] = -(pcVar3[0xb] == bVar18);
          auVar29[0xc] = -(pcVar3[0xc] == cVar32);
          auVar29[0xd] = -(pcVar3[0xd] == cVar35);
          auVar29[0xe] = -(pcVar3[0xe] == cVar38);
          auVar29[0xf] = -(bVar9 == bVar18);
          uVar10 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe);
          if (uVar10 != 0) {
            lVar27 = namedArgs._288_8_ + uVar25 * 0x10;
            lVar2 = namedArgs._296_8_ + uVar25 * 0x1e0;
            local_278 = pAVar22;
            local_248 = pSVar17;
            local_228._M_extent_value = sv._M_extent_value;
            do {
              iVar4 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
                }
              }
              pbVar21 = (basic_string_view<char,_std::char_traits<char>_> *)
                        ((ulong)(uint)(iVar4 << 5) + lVar2);
              argSyntax = (ArgumentListSyntax *)local_228._M_extent_value;
              bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )&namedArgs.super_Storage.field_0x108,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 local_228._M_extent_value,pbVar21);
              if (bVar7) {
                SVar14 = parsing::Token::location((Token *)(pbVar21[1]._M_len + 0x28));
                context = local_270;
                pDVar15 = ASTContext::addDiag(local_270,(DiagCode)0x4a0007,SVar14);
                Diagnostic::operator<<
                          (pDVar15,(local_290->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                                   name);
                __begin2 = (iterator)slang::syntax::SyntaxNode::getFirstToken(local_268);
                pAVar22 = local_278;
                uVar16 = local_288;
                SVar14 = parsing::Token::location((Token *)&__begin2);
                argSyntax = (ArgumentListSyntax *)0xc0001;
                Diagnostic::addNote(pDVar15,(DiagCode)0xc0001,SVar14);
                *(undefined1 *)&pbVar21[1]._M_str = 1;
                pIVar19 = (Info *)CONCAT71((int7)((ulong)lVar27 >> 8),1);
                goto LAB_00623113;
              }
              uVar10 = uVar10 - 1 & uVar10;
            } while (uVar10 != 0);
            bVar9 = *(byte *)(lVar27 + 0xf);
            pSVar17 = local_248;
            sv._M_extent_value = local_228._M_extent_value;
            context = local_270;
            pAVar22 = local_278;
          }
          uVar16 = local_288;
          pIVar19 = local_260;
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar9) == 0) break;
          pSVar6 = &pSVar17->kind;
          pSVar17 = (SyntaxNode *)((long)&pSVar17->kind + 1);
          uVar25 = (long)pSVar6 + uVar25 + 1 & namedArgs._280_8_;
        } while (pSVar17 <= (ulong)namedArgs._280_8_);
      }
      else {
        pSVar17 = (SyntaxNode *)&(pFVar20->super_VariableSymbol).super_ValueSymbol.super_Symbol.name
        ;
        local_288 = uVar16;
        local_278 = pAVar22;
        uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &namedArgs.super_Storage.field_0x108,
                            (basic_string_view<char,_std::char_traits<char>_> *)pSVar17);
        pSVar24 = (SyntaxNode *)(uVar13 >> (namedArgs._272_1_ & 0x3f));
        lVar2 = (uVar13 & 0xff) * 4;
        uVar30 = (&UNK_007e24cc)[lVar2];
        uVar31 = (&UNK_007e24cd)[lVar2];
        cVar32 = (&UNK_007e24ce)[lVar2];
        bVar18 = (&UNK_007e24cf)[lVar2];
        uVar16 = 0;
        uVar33 = uVar30;
        uVar34 = uVar31;
        cVar35 = cVar32;
        bVar9 = bVar18;
        uVar36 = uVar30;
        uVar37 = uVar31;
        cVar38 = cVar32;
        NVar39.raw = bVar18;
        uVar40 = uVar30;
        uVar41 = uVar31;
        cVar42 = cVar32;
        bVar43 = bVar18;
        do {
          pcVar3 = (char *)(namedArgs._288_8_ + (long)pSVar24 * 0x10);
          bVar8 = pcVar3[0xf];
          auVar28[0] = -(*pcVar3 == uVar30);
          auVar28[1] = -(pcVar3[1] == uVar31);
          auVar28[2] = -(pcVar3[2] == cVar32);
          auVar28[3] = -(pcVar3[3] == bVar18);
          auVar28[4] = -(pcVar3[4] == uVar33);
          auVar28[5] = -(pcVar3[5] == uVar34);
          auVar28[6] = -(pcVar3[6] == cVar35);
          auVar28[7] = -(pcVar3[7] == bVar9);
          auVar28[8] = -(pcVar3[8] == uVar36);
          auVar28[9] = -(pcVar3[9] == uVar37);
          auVar28[10] = -(pcVar3[10] == cVar38);
          auVar28[0xb] = -(pcVar3[0xb] == NVar39.raw);
          auVar28[0xc] = -(pcVar3[0xc] == uVar40);
          auVar28[0xd] = -(pcVar3[0xd] == uVar41);
          auVar28[0xe] = -(pcVar3[0xe] == cVar42);
          auVar28[0xf] = -(bVar8 == bVar43);
          uVar10 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
          if (uVar10 != 0) {
            local_228._M_extent_value._1_1_ = uVar31;
            local_228._M_extent_value._0_1_ = uVar30;
            local_228._M_extent_value._2_1_ = cVar32;
            local_228._M_extent_value._3_1_ = bVar18;
            local_228._M_extent_value._4_1_ = uVar33;
            local_228._M_extent_value._5_1_ = uVar34;
            local_228._M_extent_value._6_1_ = cVar35;
            local_228._M_extent_value._7_1_ = bVar9;
            lVar27 = namedArgs._288_8_ + (long)pSVar24 * 0x10;
            lVar2 = namedArgs._296_8_ + (long)pSVar24 * 0x1e0;
            local_268 = pSVar17;
            local_248 = pSVar24;
            uStack_220 = uVar36;
            uStack_21f = uVar37;
            cStack_21e = cVar38;
            NStack_21d.raw = NVar39.raw;
            uStack_21c = uVar40;
            uStack_21b = uVar41;
            cStack_21a = cVar42;
            bStack_219 = bVar43;
            do {
              iVar4 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
                }
              }
              pbVar21 = (basic_string_view<char,_std::char_traits<char>_> *)
                        ((ulong)(uint)(iVar4 << 5) + lVar2);
              bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )&namedArgs.super_Storage.field_0x108,
                                 (basic_string_view<char,_std::char_traits<char>_> *)local_268,
                                 pbVar21);
              context = local_270;
              if (bVar7) {
                *(undefined1 *)&pbVar21[1]._M_str = 1;
                argSyntax = *(ArgumentListSyntax **)(pbVar21[1]._M_len + 0x48);
                if (argSyntax == (ArgumentListSyntax *)0x0) {
                  argSyntax = (ArgumentListSyntax *)FormalArgumentSymbol::getDefaultValue(local_290)
                  ;
                  pIVar19 = local_260;
                  context = local_270;
                  pAVar22 = local_278;
                  uVar16 = local_288;
                  expr = (Expression *)argSyntax;
                  if (argSyntax == (ArgumentListSyntax *)0x0) {
                    SVar44 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pbVar21[1]._M_len)
                    ;
                    pDVar15 = ASTContext::addDiag(context,(DiagCode)0x7,SVar44);
                    psVar1 = &(local_290->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
                    argSyntax = (ArgumentListSyntax *)psVar1->_M_len;
                    Diagnostic::operator<<(pDVar15,*psVar1);
                  }
                  else {
                    bindArgs::anon_class_16_2_d3173bde::operator()
                              (&addDefaultDriver,(Expression *)argSyntax,local_290);
                  }
                  goto LAB_00623113;
                }
                pEVar11 = ASTContext::requireSimpleExpr(local_270,(PropertyExprSyntax *)argSyntax);
                pIVar19 = local_260;
                pAVar22 = local_278;
                uVar16 = local_288;
                pFVar20 = local_290;
                if (pEVar11 == (ExpressionSyntax *)0x0) goto LAB_00623113;
                pTVar12 = DeclaredType::getType
                                    (&(local_290->super_VariableSymbol).super_ValueSymbol.
                                      declaredType);
                expr = Expression::bindArgument
                                 (pTVar12,pFVar20->direction,
                                  (bitmask<slang::ast::VariableFlags>)
                                  (underlying_type)
                                  *(undefined4 *)&(pFVar20->super_VariableSymbol).flags,pEVar11,
                                  context);
                goto LAB_0062311d;
              }
              uVar10 = uVar10 - 1 & uVar10;
            } while (uVar10 != 0);
            bVar8 = *(byte *)(lVar27 + 0xf);
            pSVar17 = local_268;
            pSVar24 = local_248;
            uVar30 = (undefined1)local_228._M_extent_value;
            uVar31 = local_228._M_extent_value._1_1_;
            cVar32 = local_228._M_extent_value._2_1_;
            bVar18 = local_228._M_extent_value._3_1_;
            uVar33 = local_228._M_extent_value._4_1_;
            uVar34 = local_228._M_extent_value._5_1_;
            cVar35 = local_228._M_extent_value._6_1_;
            bVar9 = local_228._M_extent_value._7_1_;
            uVar36 = uStack_220;
            uVar37 = uStack_21f;
            cVar38 = cStack_21e;
            NVar39.raw = NStack_21d.raw;
            uVar40 = uStack_21c;
            uVar41 = uStack_21b;
            cVar42 = cStack_21a;
            bVar43 = bStack_219;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar8) == 0) break;
          lVar2 = uVar16 + 1;
          uVar16 = uVar16 + 1;
          pSVar24 = (SyntaxNode *)((long)&pSVar24->kind + lVar2 & namedArgs._280_8_);
        } while (uVar16 <= (ulong)namedArgs._280_8_);
        argSyntax = (ArgumentListSyntax *)FormalArgumentSymbol::getDefaultValue(local_290);
        pIVar19 = local_260;
        context = local_270;
        pAVar22 = local_278;
        uVar16 = local_288;
        expr = (Expression *)argSyntax;
        if (argSyntax == (ArgumentListSyntax *)0x0) {
          if (namedArgs._312_8_ == 0) {
            SVar44.endLoc = local_258;
            SVar44.startLoc = local_250;
            pDVar15 = ASTContext::addDiag(local_270,(DiagCode)0x9f0007,SVar44);
            sVar45._M_str = (char *)local_240;
            sVar45._M_len = (size_t)local_230;
            Diagnostic::operator<<(pDVar15,sVar45);
            pDVar15 = Diagnostic::operator<<<unsigned_long>(pDVar15,local_238);
            argSyntax = (ArgumentListSyntax *)
                        orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len;
            Diagnostic::operator<<<unsigned_long>
                      (pDVar15,orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.
                               len);
            pIVar19 = (Info *)0x1;
            break;
          }
          sourceRange.endLoc = local_258;
          sourceRange.startLoc = local_250;
          pDVar15 = ASTContext::addDiag(local_270,(DiagCode)0xa20007,sourceRange);
          psVar1 = &(local_290->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
          argSyntax = (ArgumentListSyntax *)psVar1->_M_len;
          Diagnostic::operator<<(pDVar15,*psVar1);
        }
        else {
          bindArgs::anon_class_16_2_d3173bde::operator()
                    (&addDefaultDriver,(Expression *)argSyntax,local_290);
        }
      }
LAB_00623113:
      if (expr == (Expression *)0x0) {
        pIVar19 = (Info *)CONCAT71((int7)((ulong)pIVar19 >> 8),1);
      }
      else {
LAB_0062311d:
        bVar7 = Expression::bad(expr);
        argSyntax = (ArgumentListSyntax *)&expr;
        SmallVectorBase<slang::ast::Expression_const*>::
        emplace_back<slang::ast::Expression_const*const&>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)boundArgs,
                   (Expression **)argSyntax);
        pIVar19 = (Info *)CONCAT71((int7)((ulong)pIVar19 >> 8),(byte)pIVar19 | bVar7);
      }
      pAVar22 = (ArgumentListSyntax *)&(pAVar22->super_SyntaxNode).parent;
    }
    pAVar22 = local_230;
    if (uVar25 < orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len) {
      sourceRange_00.endLoc = local_258;
      sourceRange_00.startLoc = local_250;
      pDVar15 = ASTContext::addDiag(context,(DiagCode)0xa00007,sourceRange_00);
      arg._M_str = (char *)local_240;
      arg._M_len = (size_t)pAVar22;
      Diagnostic::operator<<(pDVar15,arg);
      Diagnostic::operator<<<unsigned_long>(pDVar15,local_238);
      pIVar19 = (Info *)0x1;
      argSyntax = (ArgumentListSyntax *)
                  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len;
      Diagnostic::operator<<<unsigned_long>
                (pDVar15,orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len);
    }
    __begin2 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
               ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                        *)&namedArgs.super_Storage.field_0x108);
    ppVar26 = __begin2.p_;
    while (ppVar26 != (table_element_pointer)0x0) {
      if ((ppVar26->second).second == false) {
        SVar14 = parsing::Token::location(&((ppVar26->second).first)->name);
        pDVar15 = ASTContext::addDiag(context,(DiagCode)0x10007,SVar14);
        sVar45 = parsing::Token::valueText(&((ppVar26->second).first)->name);
        Diagnostic::operator<<(pDVar15,sVar45);
        pIVar19 = (Info *)0x1;
        arg_00._M_str = (char *)local_240;
        arg_00._M_len = (size_t)pAVar22;
        argSyntax = pAVar22;
        Diagnostic::operator<<(pDVar15,arg_00);
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::increment(&__begin2);
      ppVar26 = __begin2.p_;
    }
    bVar18 = (byte)pIVar19 ^ 1;
  }
  else {
    bVar18 = 0;
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                 *)&namedArgs.super_Storage.field_0x108);
  SmallVectorBase<const_slang::syntax::SyntaxNode_*>::cleanup
            (&orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>,
             (EVP_PKEY_CTX *)argSyntax);
  return (bool)(bVar18 & 1);
}

Assistant:

bool CallExpression::bindArgs(const ArgumentListSyntax* argSyntax,
                              std::span<const FormalArgumentSymbol* const> formalArgs,
                              std::string_view symbolName, SourceRange range,
                              const ASTContext& context,
                              SmallVectorBase<const Expression*>& boundArgs, bool isBuiltInMethod) {
    SmallVector<const SyntaxNode*> orderedArgs;
    NamedArgMap namedArgs;
    if (argSyntax) {
        if (!collectArgs(context, *argSyntax, orderedArgs, namedArgs))
            return false;
    }

    // Helper function to register a driver for default value arguments.
    auto addDefaultDriver = [&](const Expression& expr, const FormalArgumentSymbol& formal) {
        if (isBuiltInMethod)
            return;

        switch (formal.direction) {
            case ArgumentDirection::In:
                // Nothing to do for inputs.
                break;
            case ArgumentDirection::Out:
            case ArgumentDirection::InOut:
                // The default value binding should always use bindLValue() which
                // will always return either an AssignmentExpression or a bad expr.
                SLANG_ASSERT(expr.kind == ExpressionKind::Assignment || expr.bad());
                if (expr.kind == ExpressionKind::Assignment)
                    expr.as<AssignmentExpression>().left().requireLValue(context);
                break;
            case ArgumentDirection::Ref:
                if (!formal.flags.has(VariableFlags::Const))
                    expr.requireLValue(context);
                break;
        }
    };

    bool bad = false;
    uint32_t orderedIndex = 0;
    for (auto formal : formalArgs) {
        const Expression* expr = nullptr;
        if (orderedIndex < orderedArgs.size()) {
            auto arg = orderedArgs[orderedIndex++];
            if (arg->kind == SyntaxKind::EmptyArgument) {
                // Empty arguments are allowed as long as a default is provided.
                expr = formal->getDefaultValue();
                if (!expr)
                    context.addDiag(diag::ArgCannotBeEmpty, arg->sourceRange()) << formal->name;
                else
                    addDefaultDriver(*expr, *formal);
            }
            else if (auto exSyn = context.requireSimpleExpr(arg->as<PropertyExprSyntax>())) {
                expr = &Expression::bindArgument(formal->getType(), formal->direction,
                                                 formal->flags, *exSyn, context);
            }

            // Make sure there isn't also a named value for this argument.
            if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
                auto& diag = context.addDiag(diag::DuplicateArgAssignment,
                                             it->second.first->name.location());
                diag << formal->name;
                diag.addNote(diag::NotePreviousUsage, arg->getFirstToken().location());
                it->second.second = true;
                bad = true;
            }
        }
        else if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
            // Mark this argument as used so that we can later detect if
            // any were unused.
            it->second.second = true;

            auto arg = it->second.first->expr;
            if (!arg) {
                // Empty arguments are allowed as long as a default is provided.
                expr = formal->getDefaultValue();
                if (!expr) {
                    context.addDiag(diag::ArgCannotBeEmpty, it->second.first->sourceRange())
                        << formal->name;
                }
                else {
                    addDefaultDriver(*expr, *formal);
                }
            }
            else if (auto exSyn = context.requireSimpleExpr(*arg)) {
                expr = &Expression::bindArgument(formal->getType(), formal->direction,
                                                 formal->flags, *exSyn, context);
            }
        }
        else {
            expr = formal->getDefaultValue();
            if (!expr) {
                if (namedArgs.empty()) {
                    auto& diag = context.addDiag(diag::TooFewArguments, range);
                    diag << symbolName;
                    diag << formalArgs.size() << orderedArgs.size();
                    bad = true;
                    break;
                }
                else {
                    context.addDiag(diag::UnconnectedArg, range) << formal->name;
                }
            }
            else {
                addDefaultDriver(*expr, *formal);
            }
        }

        if (!expr) {
            bad = true;
        }
        else {
            bad |= expr->bad();
            boundArgs.push_back(expr);
        }
    }

    // Make sure there weren't too many ordered arguments provided.
    if (orderedIndex < orderedArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, range);
        diag << symbolName;
        diag << formalArgs.size();
        diag << orderedArgs.size();
        bad = true;
    }

    for (const auto& pair : namedArgs) {
        // We marked all the args that we used, so anything left over is an arg assignment
        // for a non-existent arg.
        if (!pair.second.second) {
            auto& diag = context.addDiag(diag::ArgDoesNotExist, pair.second.first->name.location());
            diag << pair.second.first->name.valueText();
            diag << symbolName;
            bad = true;
        }
    }

    return !bad;
}